

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaCommand.cpp
# Opt level: O3

int executeLoadManifestCommand
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args,bool loadOnly)

{
  uint uVar1;
  pointer pcVar2;
  StringRef filename_00;
  SmallString<10240U> *pSVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  pointer ppCVar6;
  pointer ppCVar7;
  bool bVar8;
  byte bVar9;
  int iVar10;
  pointer pbVar11;
  long lVar12;
  ostream *poVar13;
  ulong uVar14;
  basic *pbVar15;
  uint uVar16;
  pointer pbVar17;
  pointer pbVar18;
  pointer ppVar19;
  size_type sVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_02;
  undefined8 *puVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_06;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_09;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_13;
  uint uVar22;
  Pool **pool;
  _Alloc_hider _Var23;
  vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_> *__range2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *entry;
  bool bVar24;
  undefined7 in_register_00000031;
  char *pcVar25;
  string *this;
  Node **node_2;
  long *plVar26;
  Node **node_1;
  pointer ppVar27;
  long *plVar28;
  basic *pbVar29;
  ManifestLoaderImpl *pMVar30;
  __normal_iterator<llbuild::ninja::Pool_**,_std::vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_>_>
  __i;
  long lVar31;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar32;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar33;
  StringRef workingDirectory_00;
  error_code eVar34;
  StringRef str;
  StringRef str_00;
  StringRef str_01;
  StringRef str_02;
  StringRef str_03;
  StringRef str_04;
  StringRef str_05;
  vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_> pools_1;
  vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_> commands;
  vector<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_> rules;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  bindings;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  parameters;
  string filename;
  string workingDirectory;
  ManifestLoader loader;
  SmallString<128U> current_dir;
  LoadManifestActions actions;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_208;
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  ManifestLoaderImpl *local_1a8;
  basic *local_1a0;
  vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_> local_198;
  string local_178;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_158;
  _Head_base<0UL,_llbuild::ninja::ManifestLoader::ManifestLoaderImpl_*,_false> local_138;
  long *local_130;
  size_t local_128;
  long local_120 [2];
  char *local_110;
  size_t local_108;
  char local_100;
  undefined7 uStack_ff;
  ManifestLoader local_f0;
  SmallVectorImpl<char> local_e8;
  long local_d8 [16];
  ManifestLoaderActions local_58;
  undefined8 local_50;
  undefined8 local_48;
  StringRef local_40;
  
  local_1a0 = (basic *)CONCAT44(local_1a0._4_4_,(int)CONCAT71(in_register_00000031,loadOnly));
  pbVar18 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar18 == pbVar11) {
LAB_0011fb88:
    executeLoadManifestCommand();
    return 1;
  }
  sVar20 = pbVar18->_M_string_length;
  if (sVar20 == 0) {
    bVar24 = false;
  }
  else {
    bVar24 = false;
    pbVar17 = pbVar18;
    do {
      pcVar25 = (pbVar17->_M_dataplus)._M_p;
      pbVar18 = pbVar17;
      if (*pcVar25 != '-') break;
      local_e8.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
      .super_SmallVectorBase.BeginX = local_d8;
      std::__cxx11::string::_M_construct<char*>((string *)&local_e8,pcVar25,pcVar25 + sVar20);
      iVar10 = std::__cxx11::string::compare((char *)&local_e8);
      bVar8 = true;
      if (iVar10 != 0) {
        executeLoadManifestCommand();
        bVar8 = bVar24;
      }
      bVar24 = bVar8;
      if ((long *)local_e8.super_SmallVectorTemplateBase<char,_true>.
                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX !=
          local_d8) {
        operator_delete(local_e8.super_SmallVectorTemplateBase<char,_true>.
                        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
                        local_d8[0] + 1);
      }
      if (iVar10 != 0) {
        return 1;
      }
      pbVar18 = pbVar17 + 1;
      pbVar11 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar18 == pbVar11) goto LAB_0011fb88;
      sVar20 = pbVar17[1]._M_string_length;
      pbVar17 = pbVar18;
    } while (sVar20 != 0);
  }
  if (pbVar18 == pbVar11) goto LAB_0011fb88;
  local_130 = local_120;
  pcVar2 = (pbVar18->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,pcVar2,pcVar2 + pbVar18->_M_string_length);
  if (pbVar18 + 1 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    lVar12 = std::__cxx11::string::rfind((char)&local_130,0x2f);
    if (lVar12 != -1) {
      std::__cxx11::string::substr((ulong)&local_e8,(ulong)&local_130);
      iVar10 = llbuild::basic::sys::chdir
                         ((char *)local_e8.super_SmallVectorTemplateBase<char,_true>.
                                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                                  BeginX);
      if ((long *)local_e8.super_SmallVectorTemplateBase<char,_true>.
                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX !=
          local_d8) {
        operator_delete(local_e8.super_SmallVectorTemplateBase<char,_true>.
                        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
                        local_d8[0] + 1);
      }
      if ((char)iVar10 == '\0') {
        executeLoadManifestCommand();
        goto LAB_0011fff9;
      }
      std::__cxx11::string::substr((ulong)&local_e8,(ulong)&local_130);
      std::__cxx11::string::operator=((string *)&local_130,(string *)&local_e8);
      if ((long *)local_e8.super_SmallVectorTemplateBase<char,_true>.
                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX !=
          local_d8) {
        operator_delete(local_e8.super_SmallVectorTemplateBase<char,_true>.
                        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
                        local_d8[0] + 1);
      }
    }
    local_e8.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.BeginX = local_d8;
    local_e8.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Size = 0;
    local_e8.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Capacity = 0x80;
    eVar34 = llvm::sys::fs::current_path(&local_e8);
    if (eVar34._M_value == 0) {
      local_110 = &local_100;
      if ((long *)local_e8.super_SmallVectorTemplateBase<char,_true>.
                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX ==
          (long *)0x0) {
        local_108 = 0;
        local_100 = '\0';
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,
                   local_e8.super_SmallVectorTemplateBase<char,_true>.
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
                   (long)local_e8.super_SmallVectorTemplateBase<char,_true>.
                         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX +
                   (local_e8.super_SmallVectorTemplateBase<char,_true>.
                    super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ &
                   0xffffffff));
      }
      local_58._vptr_ManifestLoaderActions = (_func_int **)&PTR__ManifestLoaderActions_0020a838;
      local_50 = 0;
      local_48 = 0x1400000000;
      filename_00.Length = local_128;
      filename_00.Data = (char *)local_130;
      workingDirectory_00.Length = local_108;
      workingDirectory_00.Data = local_110;
      llbuild::ninja::ManifestLoader::ManifestLoader
                (&local_f0,workingDirectory_00,filename_00,&local_58);
      llbuild::ninja::ManifestLoader::load((ManifestLoader *)&local_138);
      plVar28 = local_130;
      if ((char)local_1a0 == '\0') {
        local_1a8 = local_138._M_head_impl;
        if (bVar24) {
          local_40.Data = (char *)local_130;
          local_40.Length = local_128;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  \"filename\": \"",0xf);
          llbuild::basic::escapeForJSON<llvm::StringRef>(&local_208.first,&local_40);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,local_208.first._M_dataplus._M_p,
                               local_208.first._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\",\n",3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208.first._M_dataplus._M_p != &local_208.first.field_2) {
            operator_delete(local_208.first._M_dataplus._M_p,
                            local_208.first.field_2._M_allocated_capacity + 1);
          }
          if (*(long *)((local_1a8->includeStack).
                        super_SmallVectorStorage<llbuild::ninja::ManifestLoader::ManifestLoaderImpl::IncludeEntry,_4U>
                        .InlineElts[1].super_AlignedCharArray<8UL,_24UL>.buffer + 8) != 0) {
            __assert_fail("manifest->getRootScope().getParent() == nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaCommand.cpp"
                          ,0x263,"void dumpNinjaManifestJSON(StringRef, ninja::Manifest *)");
          }
          local_178._M_dataplus._M_p = (pointer)0x0;
          local_178._M_string_length = 0;
          local_178.field_2._M_allocated_capacity = 0;
          plVar28 = *(long **)((local_1a8->includeStack).
                               super_SmallVectorStorage<llbuild::ninja::ManifestLoader::ManifestLoaderImpl::IncludeEntry,_4U>
                               .InlineElts[1].super_AlignedCharArray<8UL,_24UL>.buffer + 0x10);
          uVar14 = (ulong)*(uint *)(local_1a8->includeStack).
                                   super_SmallVectorStorage<llbuild::ninja::ManifestLoader::ManifestLoaderImpl::IncludeEntry,_4U>
                                   .InlineElts[2].super_AlignedCharArray<8UL,_24UL>.buffer;
          plVar26 = plVar28;
          if (uVar14 != 0) {
            for (; (*plVar26 == 0 || (*plVar26 == -8)); plVar26 = plVar26 + 1) {
            }
          }
          if (plVar26 != plVar28 + uVar14) {
            puVar21 = (undefined8 *)*plVar26;
            do {
              local_1c8._0_8_ = puVar21 + 5;
              local_1c8._8_8_ = *puVar21;
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<llvm::StringRef,_true>
                        (&local_208,(StringRef *)local_1c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (puVar21 + 1));
              std::
              vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                          *)&local_178,&local_208);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208.second._M_dataplus._M_p != &local_208.second.field_2) {
                operator_delete(local_208.second._M_dataplus._M_p,
                                local_208.second.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208.first._M_dataplus._M_p != &local_208.first.field_2) {
                operator_delete(local_208.first._M_dataplus._M_p,
                                local_208.first.field_2._M_allocated_capacity + 1);
              }
              do {
                do {
                  sVar20 = local_178._M_string_length;
                  _Var23._M_p = local_178._M_dataplus._M_p;
                  plVar26 = plVar26 + 1;
                  puVar21 = (undefined8 *)*plVar26;
                } while (puVar21 == (undefined8 *)0x0);
              } while (puVar21 == (undefined8 *)0xfffffffffffffff8);
            } while (plVar26 != plVar28 + uVar14);
            if (local_178._M_dataplus._M_p != (pointer)local_178._M_string_length) {
              uVar14 = (long)(local_178._M_string_length - (long)local_178._M_dataplus._M_p) >> 6;
              lVar12 = 0x3f;
              if (uVar14 != 0) {
                for (; uVar14 >> lVar12 == 0; lVar12 = lVar12 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                        (local_178._M_dataplus._M_p,local_178._M_string_length,
                         ((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (_Var23._M_p,sVar20);
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  \"bindings\": {\n",0x10);
          sVar20 = local_178._M_string_length;
          if (local_178._M_dataplus._M_p != (pointer)local_178._M_string_length) {
            _Var23._M_p = local_178._M_dataplus._M_p;
            do {
              if (_Var23._M_p != local_178._M_dataplus._M_p) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",\n",2);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    \"",5);
              llbuild::basic::escapeForJSON<std::__cxx11::string>
                        (&local_208.first,(basic *)_Var23._M_p,in);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,local_208.first._M_dataplus._M_p,
                                   local_208.first._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\": \"",4);
              llbuild::basic::escapeForJSON<std::__cxx11::string>
                        ((string *)local_1c8,(basic *)_Var23._M_p + 0x20,in_00);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar13,(char *)local_1c8._0_8_,local_1c8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"",1);
              if ((basic *)local_1c8._0_8_ != (basic *)(local_1c8 + 0x10)) {
                operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208.first._M_dataplus._M_p != &local_208.first.field_2) {
                operator_delete(local_208.first._M_dataplus._M_p,
                                local_208.first.field_2._M_allocated_capacity + 1);
              }
              _Var23._M_p = _Var23._M_p + 0x40;
            } while (_Var23._M_p != (pointer)sVar20);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n  },\n",6);
          if (*(int *)((local_1a8->buildCommand).super_SmallVector<char,_10240U>.
                       super_SmallVectorStorage<char,_10240U>.InlineElts + 0x3c) != 0) {
            local_1c8._0_8_ = (basic *)0x0;
            local_1c8._8_8_ = (basic *)0x0;
            local_1b8._M_allocated_capacity = 0;
            plVar28 = *(long **)&(local_1a8->buildCommand).super_SmallVector<char,_10240U>.
                                 super_SmallVectorStorage<char,_10240U>.InlineElts[0x30].
                                 super_AlignedCharArray<1UL,_1UL>;
            uVar14 = (ulong)*(uint *)((local_1a8->buildCommand).super_SmallVector<char,_10240U>.
                                      super_SmallVectorStorage<char,_10240U>.InlineElts + 0x38);
            plVar26 = plVar28;
            if (uVar14 != 0) {
              for (; (*plVar26 == 0 || (*plVar26 == -8)); plVar26 = plVar26 + 1) {
              }
            }
            if (plVar26 != plVar28 + uVar14) {
              lVar12 = *plVar26;
              do {
                if (local_1c8._8_8_ == local_1b8._M_allocated_capacity) {
                  std::vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>>::
                  _M_realloc_insert<llbuild::ninja::Pool*const&>
                            ((vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>> *)
                             local_1c8,(iterator)local_1c8._8_8_,(Pool **)(lVar12 + 8));
                }
                else {
                  *(Pool **)local_1c8._8_8_ = *(Pool **)(lVar12 + 8);
                  local_1c8._8_8_ = local_1c8._8_8_ + 8;
                }
                do {
                  do {
                    uVar5 = local_1c8._8_8_;
                    uVar4 = local_1c8._0_8_;
                    plVar26 = plVar26 + 1;
                    lVar12 = *plVar26;
                  } while (lVar12 == 0);
                } while (lVar12 == -8);
              } while (plVar26 != plVar28 + uVar14);
              if (local_1c8._0_8_ != local_1c8._8_8_) {
                lVar31 = local_1c8._8_8_ - local_1c8._0_8_;
                uVar14 = lVar31 >> 3;
                lVar12 = 0x3f;
                if (uVar14 != 0) {
                  for (; uVar14 >> lVar12 == 0; lVar12 = lVar12 + -1) {
                  }
                }
                std::
                __introsort_loop<__gnu_cxx::__normal_iterator<llbuild::ninja::Pool**,std::vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__0>>
                          (local_1c8._0_8_,local_1c8._8_8_,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
                if (lVar31 < 0x81) {
                  std::
                  __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Pool**,std::vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__0>>
                            (uVar4,uVar5);
                }
                else {
                  pbVar15 = (basic *)(uVar4 + 0x80);
                  std::
                  __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Pool**,std::vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__0>>
                            (uVar4,pbVar15);
                  for (; pbVar15 != (basic *)uVar5; pbVar15 = pbVar15 + 8) {
                    std::
                    __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llbuild::ninja::Pool**,std::vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>>>,__gnu_cxx::__ops::_Val_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__0>>
                              (pbVar15);
                  }
                }
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"  \"pools\": {\n",0xd);
            uVar4 = local_1c8._8_8_;
            for (pbVar15 = (basic *)local_1c8._0_8_; pbVar15 != (basic *)uVar4;
                pbVar15 = pbVar15 + 8) {
              pbVar29 = *(basic **)pbVar15;
              if (pbVar15 != (basic *)local_1c8._0_8_) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",\n",2);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    \"",5);
              llbuild::basic::escapeForJSON<std::__cxx11::string>(&local_208.first,pbVar29,in_01);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,local_208.first._M_dataplus._M_p,
                                   local_208.first._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\": {",4);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208.first._M_dataplus._M_p != &local_208.first.field_2) {
                operator_delete(local_208.first._M_dataplus._M_p,
                                local_208.first.field_2._M_allocated_capacity + 1);
              }
              if (*(int *)(pbVar29 + 0x20) != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"\n      \"depth\": ",0x10);
                std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n    }",6);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n  },\n",6);
            if ((basic *)local_1c8._0_8_ != (basic *)0x0) {
              operator_delete((void *)local_1c8._0_8_,
                              local_1b8._M_allocated_capacity - local_1c8._0_8_);
            }
          }
          local_198.
          super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_198.
          super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_198.
          super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          plVar28 = *(long **)(local_1a8->includeStack).
                              super_SmallVectorStorage<llbuild::ninja::ManifestLoader::ManifestLoaderImpl::IncludeEntry,_4U>
                              .InlineElts[3].super_AlignedCharArray<8UL,_24UL>.buffer;
          uVar14 = (ulong)*(uint *)((local_1a8->includeStack).
                                    super_SmallVectorStorage<llbuild::ninja::ManifestLoader::ManifestLoaderImpl::IncludeEntry,_4U>
                                    .InlineElts[3].super_AlignedCharArray<8UL,_24UL>.buffer + 8);
          plVar26 = plVar28;
          if (uVar14 != 0) {
            for (; (*plVar26 == 0 || (*plVar26 == -8)); plVar26 = plVar26 + 1) {
            }
          }
          if (plVar26 != plVar28 + uVar14) {
            lVar12 = *plVar26;
            do {
              if (local_198.
                  super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_198.
                  super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>>::
                _M_realloc_insert<llbuild::ninja::Rule*const&>
                          ((vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>> *)
                           &local_198,
                           (iterator)
                           local_198.
                           super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(Rule **)(lVar12 + 8));
              }
              else {
                *local_198.
                 super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish = (Command *)*(Rule **)(lVar12 + 8);
                local_198.
                super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_198.
                     super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
              do {
                do {
                  ppCVar7 = local_198.
                            super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  ppCVar6 = local_198.
                            super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  plVar26 = plVar26 + 1;
                  lVar12 = *plVar26;
                } while (lVar12 == 0);
              } while (lVar12 == -8);
            } while (plVar26 != plVar28 + uVar14);
            if (local_198.
                super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_198.
                super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              lVar31 = (long)local_198.
                             super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_198.
                             super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              uVar14 = lVar31 >> 3;
              lVar12 = 0x3f;
              if (uVar14 != 0) {
                for (; uVar14 >> lVar12 == 0; lVar12 = lVar12 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<llbuild::ninja::Rule**,std::vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__1>>
                        (local_198.
                         super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_198.
                         super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e
                        );
              if (lVar31 < 0x81) {
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Rule**,std::vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__1>>
                          (ppCVar6,ppCVar7);
              }
              else {
                pbVar15 = (basic *)((long)ppCVar6 + 0x80);
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Rule**,std::vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__1>>
                          (ppCVar6,pbVar15);
                for (; pbVar15 != (basic *)ppCVar7; pbVar15 = pbVar15 + 8) {
                  std::
                  __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llbuild::ninja::Rule**,std::vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>>>,__gnu_cxx::__ops::_Val_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__1>>
                            (pbVar15);
                }
              }
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  \"rules\": {\n",0xd);
          local_178.field_2._8_8_ =
               local_198.
               super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (local_198.
              super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_198.
              super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pbVar15 = (basic *)local_198.
                               super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                               ._M_impl.super__Vector_impl_data._M_start;
            do {
              pbVar29 = *(basic **)pbVar15;
              local_1a0 = pbVar15;
              if (pbVar15 !=
                  (basic *)local_198.
                           super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",\n",2);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    \"",5);
              llbuild::basic::escapeForJSON<std::__cxx11::string>(&local_208.first,pbVar29,in_02);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,local_208.first._M_dataplus._M_p,
                                   local_208.first._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\": {\n",5);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208.first._M_dataplus._M_p != &local_208.first.field_2) {
                operator_delete(local_208.first._M_dataplus._M_p,
                                local_208.first.field_2._M_allocated_capacity + 1);
              }
              local_158.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_158.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_158.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              plVar28 = *(long **)(pbVar29 + 0x20);
              uVar22 = *(uint *)(pbVar29 + 0x28);
              plVar26 = plVar28;
              if ((ulong)uVar22 != 0) {
                for (; (*plVar26 == 0 || (*plVar26 == -8)); plVar26 = plVar26 + 1) {
                }
              }
              if (plVar26 != plVar28 + uVar22) {
                puVar21 = (undefined8 *)*plVar26;
                do {
                  local_1c8._0_8_ = puVar21 + 5;
                  local_1c8._8_8_ = *puVar21;
                  std::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::pair<llvm::StringRef,_true>
                            (&local_208,(StringRef *)local_1c8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (puVar21 + 1));
                  std::
                  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                            ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                              *)&local_158,&local_208);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_208.second._M_dataplus._M_p != &local_208.second.field_2) {
                    operator_delete(local_208.second._M_dataplus._M_p,
                                    local_208.second.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_208.first._M_dataplus._M_p != &local_208.first.field_2) {
                    operator_delete(local_208.first._M_dataplus._M_p,
                                    local_208.first.field_2._M_allocated_capacity + 1);
                  }
                  do {
                    do {
                      ppVar27 = local_158.
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                      ppVar19 = local_158.
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      plVar26 = plVar26 + 1;
                      puVar21 = (undefined8 *)*plVar26;
                    } while (puVar21 == (undefined8 *)0x0);
                  } while (puVar21 == (undefined8 *)0xfffffffffffffff8);
                } while (plVar26 != plVar28 + uVar22);
                if (local_158.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start !=
                    local_158.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  uVar14 = (long)local_158.
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_158.
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 6;
                  lVar12 = 0x3f;
                  if (uVar14 != 0) {
                    for (; uVar14 >> lVar12 == 0; lVar12 = lVar12 + -1) {
                    }
                  }
                  std::
                  __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                            (local_158.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             local_158.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             ((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
                  std::
                  __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                            (ppVar19,ppVar27);
                  ppVar19 = local_158.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  for (ppVar27 = local_158.
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start; ppVar27 != ppVar19;
                      ppVar27 = ppVar27 + 1) {
                    if (ppVar27 !=
                        local_158.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,",\n",2);
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"      \"",7);
                    llbuild::basic::escapeForJSON<std::__cxx11::string>
                              (&local_208.first,(basic *)ppVar27,in_03);
                    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,local_208.first._M_dataplus._M_p,
                                         local_208.first._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\": \"",4);
                    llbuild::basic::escapeForJSON<std::__cxx11::string>
                              ((string *)local_1c8,(basic *)&ppVar27->second,in_04);
                    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar13,(char *)local_1c8._0_8_,local_1c8._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"",1);
                    if ((basic *)local_1c8._0_8_ != (basic *)(local_1c8 + 0x10)) {
                      operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_208.first._M_dataplus._M_p != &local_208.first.field_2) {
                      operator_delete(local_208.first._M_dataplus._M_p,
                                      local_208.first.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n    }",6);
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector(&local_158);
              pbVar15 = local_1a0 + 8;
            } while (pbVar15 != (basic *)local_178.field_2._8_8_);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n  },\n",6);
          if (*(long *)&(local_1a8->buildCommand).super_SmallVector<char,_10240U>.
                        super_SmallVectorStorage<char,_10240U>.InlineElts[0x50].
                        super_AlignedCharArray<1UL,_1UL> !=
              *(long *)((local_1a8->buildCommand).super_SmallVector<char,_10240U>.
                        super_SmallVectorStorage<char,_10240U>.InlineElts + 0x58)) {
            std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>::vector
                      ((vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_> *)
                       local_1c8,
                       (vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_> *)
                       ((local_1a8->buildCommand).super_SmallVector<char,_10240U>.
                        super_SmallVectorStorage<char,_10240U>.InlineElts + 0x50));
            uVar5 = local_1c8._8_8_;
            uVar4 = local_1c8._0_8_;
            if (local_1c8._0_8_ != local_1c8._8_8_) {
              lVar31 = local_1c8._8_8_ - local_1c8._0_8_;
              uVar14 = lVar31 >> 3;
              lVar12 = 0x3f;
              if (uVar14 != 0) {
                for (; uVar14 >> lVar12 == 0; lVar12 = lVar12 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<llbuild::ninja::Node**,std::vector<llbuild::ninja::Node*,std::allocator<llbuild::ninja::Node*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__2>>
                        (local_1c8._0_8_,local_1c8._8_8_,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
              if (lVar31 < 0x81) {
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Node**,std::vector<llbuild::ninja::Node*,std::allocator<llbuild::ninja::Node*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__2>>
                          (uVar4,uVar5);
              }
              else {
                pbVar15 = (basic *)(uVar4 + 0x80);
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Node**,std::vector<llbuild::ninja::Node*,std::allocator<llbuild::ninja::Node*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__2>>
                          (uVar4,pbVar15);
                for (; pbVar15 != (basic *)uVar5; pbVar15 = pbVar15 + 8) {
                  std::
                  __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llbuild::ninja::Node**,std::vector<llbuild::ninja::Node*,std::allocator<llbuild::ninja::Node*>>>,__gnu_cxx::__ops::_Val_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__2>>
                            (pbVar15);
                }
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"  \"default_targets\": [",0x16);
            uVar4 = local_1c8._8_8_;
            for (pbVar15 = (basic *)local_1c8._0_8_; pbVar15 != (basic *)uVar4;
                pbVar15 = pbVar15 + 8) {
              if (pbVar15 != (basic *)local_1c8._0_8_) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"",1);
              llbuild::basic::escapeForJSON<std::__cxx11::string>
                        (&local_208.first,(basic *)(*(long *)pbVar15 + 0x20),in_05);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,local_208.first._M_dataplus._M_p,
                                   local_208.first._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208.first._M_dataplus._M_p != &local_208.first.field_2) {
                operator_delete(local_208.first._M_dataplus._M_p,
                                local_208.first.field_2._M_allocated_capacity + 1);
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"],\n",3);
            if ((basic *)local_1c8._0_8_ != (basic *)0x0) {
              operator_delete((void *)local_1c8._0_8_,
                              local_1b8._M_allocated_capacity - local_1c8._0_8_);
            }
          }
          std::vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>::vector
                    ((vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                      *)local_1c8,
                     (vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                      *)((local_1a8->buildCommand).super_SmallVector<char,_10240U>.
                         super_SmallVectorStorage<char,_10240U>.InlineElts + 0x18));
          uVar5 = local_1c8._8_8_;
          uVar4 = local_1c8._0_8_;
          if (local_1c8._0_8_ != local_1c8._8_8_) {
            lVar31 = local_1c8._8_8_ - local_1c8._0_8_;
            uVar14 = lVar31 >> 3;
            lVar12 = 0x3f;
            if (uVar14 != 0) {
              for (; uVar14 >> lVar12 == 0; lVar12 = lVar12 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<llbuild::ninja::Command**,std::vector<llbuild::ninja::Command*,std::allocator<llbuild::ninja::Command*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__3>>
                      (local_1c8._0_8_,local_1c8._8_8_,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
            if (lVar31 < 0x81) {
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Command**,std::vector<llbuild::ninja::Command*,std::allocator<llbuild::ninja::Command*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__3>>
                        (uVar4,uVar5);
            }
            else {
              pbVar15 = (basic *)(uVar4 + 0x80);
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Command**,std::vector<llbuild::ninja::Command*,std::allocator<llbuild::ninja::Command*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__3>>
                        (uVar4,pbVar15);
              for (; pbVar15 != (basic *)uVar5; pbVar15 = pbVar15 + 8) {
                std::
                __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llbuild::ninja::Command**,std::vector<llbuild::ninja::Command*,std::allocator<llbuild::ninja::Command*>>>,__gnu_cxx::__ops::_Val_comp_iter<dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__3>>
                          (pbVar15);
              }
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  \"commands\": [\n",0x10);
          local_178.field_2._8_8_ = local_1c8._8_8_;
          pbVar15 = (basic *)local_1c8._0_8_;
          if (local_1c8._0_8_ != local_1c8._8_8_) {
            do {
              lVar12 = *(long *)pbVar15;
              local_1a0 = pbVar15;
              if (pbVar15 != (basic *)local_1c8._0_8_) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",\n",2);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    {\n",6);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"      \"outputs\": [",0x12);
              plVar26 = *(long **)(lVar12 + 0x18);
              for (plVar28 = *(long **)(lVar12 + 0x10); plVar28 != plVar26; plVar28 = plVar28 + 1) {
                if (plVar28 != *(long **)(lVar12 + 0x10)) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"",1);
                llbuild::basic::escapeForJSON<std::__cxx11::string>
                          (&local_208.first,(basic *)(*plVar28 + 0x20),in_06);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,local_208.first._M_dataplus._M_p,
                                     local_208.first._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_208.first._M_dataplus._M_p != &local_208.first.field_2) {
                  operator_delete(local_208.first._M_dataplus._M_p,
                                  local_208.first.field_2._M_allocated_capacity + 1);
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"],\n",3);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"      \"rule\": \"",0xf);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,(char *)**(undefined8 **)(lVar12 + 8),
                                   (*(undefined8 **)(lVar12 + 8))[1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\",\n",3);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"      \"inputs\": [",0x11);
              if ((ulong)*(uint *)(lVar12 + 0x40) != 0) {
                plVar28 = *(long **)(lVar12 + 0x28);
                lVar31 = (ulong)*(uint *)(lVar12 + 0x40) << 3;
                do {
                  if (plVar28 != *(long **)(lVar12 + 0x28)) {
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2)
                    ;
                  }
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"",1);
                  llbuild::basic::escapeForJSON<std::__cxx11::string>
                            (&local_208.first,(basic *)(*plVar28 + 0x20),in_07);
                  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,local_208.first._M_dataplus._M_p,
                                       local_208.first._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_208.first._M_dataplus._M_p != &local_208.first.field_2) {
                    operator_delete(local_208.first._M_dataplus._M_p,
                                    local_208.first.field_2._M_allocated_capacity + 1);
                  }
                  plVar28 = plVar28 + 1;
                  lVar31 = lVar31 + -8;
                } while (lVar31 != 0);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"],\n",3);
              if (*(int *)(lVar12 + 0x44) == 0) {
                iVar10 = 0;
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"      \"implicit_inputs\": [",0x1a);
                if ((ulong)*(uint *)(lVar12 + 0x44) != 0) {
                  plVar28 = (long *)((ulong)*(uint *)(lVar12 + 0x40) * 8 + *(long *)(lVar12 + 0x28))
                  ;
                  lVar31 = (ulong)*(uint *)(lVar12 + 0x44) << 3;
                  do {
                    if (plVar28 !=
                        (long *)((ulong)*(uint *)(lVar12 + 0x40) * 8 + *(long *)(lVar12 + 0x28))) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,", ",2);
                    }
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"",1)
                    ;
                    llbuild::basic::escapeForJSON<std::__cxx11::string>
                              (&local_208.first,(basic *)(*plVar28 + 0x20),in_08);
                    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,local_208.first._M_dataplus._M_p,
                                         local_208.first._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_208.first._M_dataplus._M_p != &local_208.first.field_2) {
                      operator_delete(local_208.first._M_dataplus._M_p,
                                      local_208.first.field_2._M_allocated_capacity + 1);
                    }
                    plVar28 = plVar28 + 1;
                    lVar31 = lVar31 + -8;
                  } while (lVar31 != 0);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"],\n",3);
                iVar10 = *(int *)(lVar12 + 0x44);
              }
              if ((int)((ulong)(*(long *)(lVar12 + 0x30) - *(long *)(lVar12 + 0x28)) >> 3) !=
                  iVar10 + *(int *)(lVar12 + 0x40)) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"      \"order_only_inputs\": [",0x1c);
                plVar26 = *(long **)(lVar12 + 0x30);
                for (plVar28 = (long *)((ulong)*(uint *)(lVar12 + 0x40) * 8 +
                                        *(long *)(lVar12 + 0x28) +
                                       (ulong)*(uint *)(lVar12 + 0x44) * 8); plVar28 != plVar26;
                    plVar28 = plVar28 + 1) {
                  if (plVar28 !=
                      (long *)((ulong)*(uint *)(lVar12 + 0x40) * 8 + *(long *)(lVar12 + 0x28) +
                              (ulong)*(uint *)(lVar12 + 0x44) * 8)) {
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2)
                    ;
                  }
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"",1);
                  llbuild::basic::escapeForJSON<std::__cxx11::string>
                            (&local_208.first,(basic *)(*plVar28 + 0x20),in_09);
                  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,local_208.first._M_dataplus._M_p,
                                       local_208.first._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_208.first._M_dataplus._M_p != &local_208.first.field_2) {
                    operator_delete(local_208.first._M_dataplus._M_p,
                                    local_208.first.field_2._M_allocated_capacity + 1);
                  }
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"],\n",3);
              }
              bVar9 = *(byte *)(lVar12 + 0x110);
              if ((bVar9 & 4) != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"      \"generator\": true,\n",0x19);
                bVar9 = *(byte *)(lVar12 + 0x110);
              }
              if ((bVar9 & 8) != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"      \"restat\": true,\n",0x16);
              }
              pbVar15 = *(basic **)(lVar12 + 0x68);
              if (pbVar15 != (basic *)0x0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"      \"pool\": \"",0xf);
                llbuild::basic::escapeForJSON<std::__cxx11::string>(&local_208.first,pbVar15,in_10);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,local_208.first._M_dataplus._M_p,
                                     local_208.first._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\",\n",3);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_208.first._M_dataplus._M_p != &local_208.first.field_2) {
                  operator_delete(local_208.first._M_dataplus._M_p,
                                  local_208.first.field_2._M_allocated_capacity + 1);
                }
              }
              pbVar29 = local_1a0;
              bVar9 = *(byte *)(lVar12 + 0x110) & 3;
              if (bVar9 == 2) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"      \"deps\": \"msvc\",\n",0x16);
                pbVar29 = local_1a0;
              }
              else if (bVar9 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"      \"deps\": \"gcc\",\n",0x15);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"      \"depfile\": \"",0x12);
                llbuild::basic::escapeForJSON<std::__cxx11::string>
                          (&local_208.first,(basic *)(lVar12 + 0xb0),in_11);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,local_208.first._M_dataplus._M_p,
                                     local_208.first._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\",\n",3);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_208.first._M_dataplus._M_p != &local_208.first.field_2) {
                  operator_delete(local_208.first._M_dataplus._M_p,
                                  local_208.first.field_2._M_allocated_capacity + 1);
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"      \"command\": \"",0x12);
              llbuild::basic::escapeForJSON<std::__cxx11::string>
                        (&local_208.first,(basic *)(lVar12 + 0x70),in_12);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,local_208.first._M_dataplus._M_p,
                                   local_208.first._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\",\n",3);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208.first._M_dataplus._M_p != &local_208.first.field_2) {
                operator_delete(local_208.first._M_dataplus._M_p,
                                local_208.first.field_2._M_allocated_capacity + 1);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"      \"description\": \"",0x16);
              llbuild::basic::escapeForJSON<std::__cxx11::string>
                        (&local_208.first,(basic *)(lVar12 + 0x90),in_13);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,local_208.first._M_dataplus._M_p,
                                   local_208.first._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"\n",2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208.first._M_dataplus._M_p != &local_208.first.field_2) {
                operator_delete(local_208.first._M_dataplus._M_p,
                                local_208.first.field_2._M_allocated_capacity + 1);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    }",5);
              pbVar15 = pbVar29 + 8;
            } while (pbVar29 + 8 != (basic *)local_178.field_2._8_8_);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n  ]\n",5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}\n",2);
          if ((basic *)local_1c8._0_8_ != (basic *)0x0) {
            operator_delete((void *)local_1c8._0_8_,
                            local_1b8._M_allocated_capacity - local_1c8._0_8_);
          }
          if ((basic *)local_198.
                       super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                       ._M_impl.super__Vector_impl_data._M_start != (basic *)0x0) {
            operator_delete(local_198.
                            super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_198.
                                  super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_198.
                                  super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          this = &local_178;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"# Loaded Manifest: \"",0x14);
          paVar33 = &local_208.first.field_2;
          local_208.first._M_dataplus._M_p = (pointer)paVar33;
          if (plVar28 == (long *)0x0) {
            local_208.first._M_string_length = 0;
            local_208.first.field_2._M_allocated_capacity =
                 local_208.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_208,plVar28,(char *)((long)plVar28 + local_128));
          }
          pMVar30 = local_1a8;
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,local_208.first._M_dataplus._M_p,
                               local_208.first._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"\n",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208.first._M_dataplus._M_p != paVar33) {
            operator_delete(local_208.first._M_dataplus._M_p,
                            local_208.first.field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"# Top-Level Bindings\n",0x15);
          if (*(long *)((pMVar30->includeStack).
                        super_SmallVectorStorage<llbuild::ninja::ManifestLoader::ManifestLoaderImpl::IncludeEntry,_4U>
                        .InlineElts[1].super_AlignedCharArray<8UL,_24UL>.buffer + 8) != 0) {
            __assert_fail("manifest->getRootScope().getParent() == nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaCommand.cpp"
                          ,0x1d4,"void dumpNinjaManifestText(StringRef, ninja::Manifest *)");
          }
          local_1c8._0_8_ = (basic *)0x0;
          local_1c8._8_8_ = (basic *)0x0;
          local_1b8._M_allocated_capacity = 0;
          plVar28 = *(long **)((pMVar30->includeStack).
                               super_SmallVectorStorage<llbuild::ninja::ManifestLoader::ManifestLoaderImpl::IncludeEntry,_4U>
                               .InlineElts[1].super_AlignedCharArray<8UL,_24UL>.buffer + 0x10);
          uVar14 = (ulong)*(uint *)(pMVar30->includeStack).
                                   super_SmallVectorStorage<llbuild::ninja::ManifestLoader::ManifestLoaderImpl::IncludeEntry,_4U>
                                   .InlineElts[2].super_AlignedCharArray<8UL,_24UL>.buffer;
          plVar26 = plVar28;
          if (uVar14 != 0) {
            for (; (*plVar26 == 0 || (*plVar26 == -8)); plVar26 = plVar26 + 1) {
            }
          }
          if (plVar26 != plVar28 + uVar14) {
            puVar21 = (undefined8 *)*plVar26;
            do {
              local_178._M_dataplus._M_p = (pointer)(puVar21 + 5);
              pbVar15 = (basic *)*puVar21;
              local_178._M_string_length = (size_type)pbVar15;
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<llvm::StringRef,_true>
                        (&local_208,(StringRef *)&local_178,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (puVar21 + 1));
              std::
              vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                          *)local_1c8,&local_208);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208.second._M_dataplus._M_p != &local_208.second.field_2) {
                operator_delete(local_208.second._M_dataplus._M_p,
                                local_208.second.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208.first._M_dataplus._M_p != &local_208.first.field_2) {
                operator_delete(local_208.first._M_dataplus._M_p,
                                local_208.first.field_2._M_allocated_capacity + 1);
              }
              do {
                do {
                  uVar5 = local_1c8._8_8_;
                  uVar4 = local_1c8._0_8_;
                  plVar26 = plVar26 + 1;
                  puVar21 = (undefined8 *)*plVar26;
                } while (puVar21 == (undefined8 *)0x0);
              } while (puVar21 == (undefined8 *)0xfffffffffffffff8);
            } while (plVar26 != plVar28 + uVar14);
            if (local_1c8._0_8_ != local_1c8._8_8_) {
              uVar14 = (long)(local_1c8._8_8_ - local_1c8._0_8_) >> 6;
              lVar12 = 0x3f;
              if (uVar14 != 0) {
                for (; uVar14 >> lVar12 == 0; lVar12 = lVar12 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                        (local_1c8._0_8_,local_1c8._8_8_,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (uVar4,uVar5);
              uVar4 = local_1c8._8_8_;
              for (pbVar29 = (basic *)local_1c8._0_8_; pbVar29 != (basic *)uVar4;
                  pbVar29 = pbVar29 + 0x40) {
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,*(char **)pbVar29,*(long *)(pbVar29 + 8))
                ;
                std::__ostream_insert<char,std::char_traits<char>>(poVar13," = \"",4);
                str.Length = (size_t)pbVar15;
                str.Data = *(char **)(pbVar29 + 0x28);
                llbuild::commands::util::escapedString_abi_cxx11_
                          (&local_208.first,*(util **)(pbVar29 + 0x20),str);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar13,local_208.first._M_dataplus._M_p,
                                     local_208.first._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"\n",2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_208.first._M_dataplus._M_p != &local_208.first.field_2) {
                  operator_delete(local_208.first._M_dataplus._M_p,
                                  local_208.first.field_2._M_allocated_capacity + 1);
                }
              }
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          pMVar30 = local_1a8;
          if (*(int *)((local_1a8->buildCommand).super_SmallVector<char,_10240U>.
                       super_SmallVectorStorage<char,_10240U>.InlineElts + 0x3c) != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# Pools\n",8);
            local_208.first._M_dataplus._M_p = (pointer)0x0;
            local_208.first._M_string_length = 0;
            local_208.first.field_2._M_allocated_capacity = 0;
            plVar28 = *(long **)&(pMVar30->buildCommand).super_SmallVector<char,_10240U>.
                                 super_SmallVectorStorage<char,_10240U>.InlineElts[0x30].
                                 super_AlignedCharArray<1UL,_1UL>;
            uVar14 = (ulong)*(uint *)((pMVar30->buildCommand).super_SmallVector<char,_10240U>.
                                      super_SmallVectorStorage<char,_10240U>.InlineElts + 0x38);
            plVar26 = plVar28;
            if (uVar14 != 0) {
              for (; (*plVar26 == 0 || (*plVar26 == -8)); plVar26 = plVar26 + 1) {
              }
            }
            _Var23._M_p = local_208.first._M_dataplus._M_p;
            paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_208.first._M_string_length;
            pMVar30 = local_1a8;
            if (plVar26 != plVar28 + uVar14) {
              lVar12 = *plVar26;
              do {
                if (local_208.first._M_string_length ==
                    local_208.first.field_2._M_allocated_capacity) {
                  std::vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>>::
                  _M_realloc_insert<llbuild::ninja::Pool*const&>
                            ((vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>> *)
                             &local_208,(iterator)local_208.first._M_string_length,
                             (Pool **)(lVar12 + 8));
                }
                else {
                  *(Pool **)local_208.first._M_string_length = *(Pool **)(lVar12 + 8);
                  local_208.first._M_string_length = local_208.first._M_string_length + 8;
                }
                do {
                  do {
                    sVar20 = local_208.first._M_string_length;
                    _Var23._M_p = local_208.first._M_dataplus._M_p;
                    plVar26 = plVar26 + 1;
                    lVar12 = *plVar26;
                  } while (lVar12 == 0);
                } while (lVar12 == -8);
              } while (plVar26 != plVar28 + uVar14);
              paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_208.first._M_string_length;
              pMVar30 = local_1a8;
              if (local_208.first._M_dataplus._M_p != (pointer)local_208.first._M_string_length) {
                lVar31 = local_208.first._M_string_length - (long)local_208.first._M_dataplus._M_p;
                uVar14 = lVar31 >> 3;
                lVar12 = 0x3f;
                if (uVar14 != 0) {
                  for (; uVar14 >> lVar12 == 0; lVar12 = lVar12 + -1) {
                  }
                }
                std::
                __introsort_loop<__gnu_cxx::__normal_iterator<llbuild::ninja::Pool**,std::vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__0>>
                          (local_208.first._M_dataplus._M_p,local_208.first._M_string_length,
                           ((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
                if (lVar31 < 0x81) {
                  std::
                  __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Pool**,std::vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__0>>
                            (_Var23._M_p,sVar20);
                  _Var23._M_p = local_208.first._M_dataplus._M_p;
                  paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_208.first._M_string_length;
                  pMVar30 = local_1a8;
                }
                else {
                  paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(_Var23._M_p + 0x80);
                  std::
                  __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Pool**,std::vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__0>>
                            (_Var23._M_p,paVar32);
                  for (; _Var23._M_p = local_208.first._M_dataplus._M_p,
                      paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_208.first._M_string_length, pMVar30 = local_1a8,
                      paVar32 !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)sVar20;
                      paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(&paVar32->_M_allocated_capacity + 1)) {
                    std::
                    __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llbuild::ninja::Pool**,std::vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>>>,__gnu_cxx::__ops::_Val_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__0>>
                              (paVar32);
                  }
                }
              }
            }
            for (; sVar20 = local_208.first._M_string_length, local_1a8 = pMVar30,
                _Var23._M_p != (pointer)local_208.first._M_string_length;
                _Var23._M_p = (pointer)((long)_Var23._M_p + 8)) {
              local_208.first._M_string_length = (size_type)paVar33;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pool ",5);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,(char *)**(undefined8 **)_Var23._M_p,
                                   (*(undefined8 **)_Var23._M_p)[1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
              if (*(int *)(*(size_type *)_Var23._M_p + 0x20) != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"  depth = ",10);
                poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
              paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_208.first._M_string_length;
              pMVar30 = local_1a8;
              local_208.first._M_string_length = sVar20;
            }
            local_208.first._M_string_length = (size_type)paVar33;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208.first._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_208.first._M_dataplus._M_p,
                              local_208.first.field_2._M_allocated_capacity -
                              (long)local_208.first._M_dataplus._M_p);
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# Rules\n",8);
          local_178._M_dataplus._M_p = (pointer)0x0;
          local_178._M_string_length = 0;
          local_178.field_2._M_allocated_capacity = 0;
          plVar28 = *(long **)(pMVar30->includeStack).
                              super_SmallVectorStorage<llbuild::ninja::ManifestLoader::ManifestLoaderImpl::IncludeEntry,_4U>
                              .InlineElts[3].super_AlignedCharArray<8UL,_24UL>.buffer;
          ppVar19 = (pointer)(ulong)*(uint *)((pMVar30->includeStack).
                                              super_SmallVectorStorage<llbuild::ninja::ManifestLoader::ManifestLoaderImpl::IncludeEntry,_4U>
                                              .InlineElts[3].super_AlignedCharArray<8UL,_24UL>.
                                              buffer + 8);
          plVar26 = plVar28;
          if (ppVar19 != (pointer)0x0) {
            for (; (*plVar26 == 0 || (*plVar26 == -8)); plVar26 = plVar26 + 1) {
            }
          }
          plVar28 = plVar28 + (long)ppVar19;
          if (plVar26 != plVar28) {
            lVar12 = *plVar26;
            do {
              if (local_178._M_string_length == local_178.field_2._M_allocated_capacity) {
                std::vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>>::
                _M_realloc_insert<llbuild::ninja::Rule*const&>
                          ((vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>> *)
                           &local_178,(iterator)local_178._M_string_length,(Rule **)(lVar12 + 8));
              }
              else {
                *(Rule **)local_178._M_string_length = *(Rule **)(lVar12 + 8);
                local_178._M_string_length = local_178._M_string_length + 8;
              }
              do {
                do {
                  sVar20 = local_178._M_string_length;
                  _Var23._M_p = local_178._M_dataplus._M_p;
                  plVar26 = plVar26 + 1;
                  lVar12 = *plVar26;
                } while (lVar12 == 0);
              } while (lVar12 == -8);
            } while (plVar26 != plVar28);
            if (local_178._M_dataplus._M_p != (pointer)local_178._M_string_length) {
              lVar31 = local_178._M_string_length - (long)local_178._M_dataplus._M_p;
              uVar14 = lVar31 >> 3;
              lVar12 = 0x3f;
              if (uVar14 != 0) {
                for (; uVar14 >> lVar12 == 0; lVar12 = lVar12 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<llbuild::ninja::Rule**,std::vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__1>>
                        (local_178._M_dataplus._M_p,local_178._M_string_length,
                         ((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
              if (lVar31 < 0x81) {
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Rule**,std::vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__1>>
                          (_Var23._M_p,sVar20);
              }
              else {
                pbVar15 = (basic *)(_Var23._M_p + 0x80);
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Rule**,std::vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__1>>
                          (_Var23._M_p,pbVar15);
                for (; pbVar15 != (basic *)sVar20; pbVar15 = pbVar15 + 8) {
                  std::
                  __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llbuild::ninja::Rule**,std::vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>>>,__gnu_cxx::__ops::_Val_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__1>>
                            (pbVar15);
                }
              }
            }
          }
          local_178.field_2._8_8_ = local_178._M_string_length;
          if (local_178._M_dataplus._M_p != (pointer)local_178._M_string_length) {
            paVar33 = &local_208.first.field_2;
            _Var23._M_p = local_178._M_dataplus._M_p;
            do {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rule ",5);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,(char *)**(undefined8 **)_Var23._M_p,
                                   (*(undefined8 **)_Var23._M_p)[1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
              local_198.
              super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_198.
              super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_198.
              super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              plVar28 = *(long **)(*(long *)_Var23._M_p + 0x20);
              ppVar19 = (pointer)(ulong)*(uint *)(*(long *)_Var23._M_p + 0x28);
              plVar26 = plVar28;
              if (ppVar19 != (pointer)0x0) {
                for (; (*plVar26 == 0 || (*plVar26 == -8)); plVar26 = plVar26 + 1) {
                }
              }
              plVar28 = plVar28 + (long)ppVar19;
              local_1a0 = (basic *)_Var23._M_p;
              if (plVar26 != plVar28) {
                puVar21 = (undefined8 *)*plVar26;
                do {
                  local_158.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)(puVar21 + 5);
                  ppVar19 = (pointer)*puVar21;
                  local_158.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = ppVar19;
                  std::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::pair<llvm::StringRef,_true>
                            (&local_208,(StringRef *)&local_158,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (puVar21 + 1));
                  std::
                  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                            ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                              *)&local_198,&local_208);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_208.second._M_dataplus._M_p != &local_208.second.field_2) {
                    operator_delete(local_208.second._M_dataplus._M_p,
                                    local_208.second.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_208.first._M_dataplus._M_p != paVar33) {
                    operator_delete(local_208.first._M_dataplus._M_p,
                                    local_208.first.field_2._M_allocated_capacity + 1);
                  }
                  do {
                    do {
                      ppCVar7 = local_198.
                                super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                      ppCVar6 = local_198.
                                super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      plVar26 = plVar26 + 1;
                      puVar21 = (undefined8 *)*plVar26;
                    } while (puVar21 == (undefined8 *)0x0);
                  } while (puVar21 == (undefined8 *)0xfffffffffffffff8);
                } while (plVar26 != plVar28);
                if (local_198.
                    super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                    ._M_impl.super__Vector_impl_data._M_start !=
                    local_198.
                    super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  uVar14 = (long)local_198.
                                 super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_198.
                                 super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 6;
                  lVar12 = 0x3f;
                  if (uVar14 != 0) {
                    for (; uVar14 >> lVar12 == 0; lVar12 = lVar12 + -1) {
                    }
                  }
                  std::
                  __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                            (local_198.
                             super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             local_198.
                             super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             ((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
                  std::
                  __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                            (ppCVar6,ppCVar7);
                  ppCVar6 = local_198.
                            super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  for (pbVar15 = (basic *)local_198.
                                          super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start;
                      pbVar15 != (basic *)ppCVar6; pbVar15 = pbVar15 + 0x40) {
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2)
                    ;
                    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,*(char **)pbVar15,
                                         *(long *)(pbVar15 + 8));
                    std::__ostream_insert<char,std::char_traits<char>>(poVar13," = \"",4);
                    str_00.Length = (size_t)ppVar19;
                    str_00.Data = *(char **)(pbVar15 + 0x28);
                    llbuild::commands::util::escapedString_abi_cxx11_
                              (&local_208.first,*(util **)(pbVar15 + 0x20),str_00);
                    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar13,local_208.first._M_dataplus._M_p,
                                         local_208.first._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"\n",2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_208.first._M_dataplus._M_p != paVar33) {
                      operator_delete(local_208.first._M_dataplus._M_p,
                                      local_208.first.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_198);
              _Var23._M_p = (pointer)(local_1a0 + 8);
            } while (_Var23._M_p != (pointer)local_178.field_2._8_8_);
          }
          std::vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>::vector
                    (&local_198,
                     (vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                      *)((local_1a8->buildCommand).super_SmallVector<char,_10240U>.
                         super_SmallVectorStorage<char,_10240U>.InlineElts + 0x18));
          ppCVar7 = local_198.
                    super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          ppCVar6 = local_198.
                    super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (local_198.
              super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_198.
              super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            lVar31 = (long)local_198.
                           super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_198.
                           super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            uVar14 = lVar31 >> 3;
            lVar12 = 0x3f;
            if (uVar14 != 0) {
              for (; uVar14 >> lVar12 == 0; lVar12 = lVar12 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<llbuild::ninja::Command**,std::vector<llbuild::ninja::Command*,std::allocator<llbuild::ninja::Command*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__2>>
                      (local_198.
                       super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_198.
                       super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
            if (lVar31 < 0x81) {
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Command**,std::vector<llbuild::ninja::Command*,std::allocator<llbuild::ninja::Command*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__2>>
                        (ppCVar6,ppCVar7);
            }
            else {
              pbVar15 = (basic *)((long)ppCVar6 + 0x80);
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Command**,std::vector<llbuild::ninja::Command*,std::allocator<llbuild::ninja::Command*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__2>>
                        (ppCVar6,pbVar15);
              for (; pbVar15 != (basic *)ppCVar7; pbVar15 = pbVar15 + 8) {
                std::
                __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llbuild::ninja::Command**,std::vector<llbuild::ninja::Command*,std::allocator<llbuild::ninja::Command*>>>,__gnu_cxx::__ops::_Val_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__2>>
                          (pbVar15);
              }
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"# Commands\n",0xb);
          local_1a0 = (basic *)local_198.
                               super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
          pbVar15 = (basic *)local_198.
                             super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                             ._M_impl.super__Vector_impl_data._M_start;
          if (local_198.
              super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_198.
              super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            do {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"build",5);
              plVar26 = *(long **)(*(long *)pbVar15 + 0x18);
              for (plVar28 = *(long **)(*(long *)pbVar15 + 0x10); plVar28 != plVar26;
                  plVar28 = plVar28 + 1) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," \"",2);
                str_01.Length = (size_t)ppVar19;
                str_01.Data = *(char **)(*plVar28 + 0x28);
                llbuild::commands::util::escapedString_abi_cxx11_
                          (&local_208.first,*(util **)(*plVar28 + 0x20),str_01);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,local_208.first._M_dataplus._M_p,
                                     local_208.first._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_208.first._M_dataplus._M_p != &local_208.first.field_2) {
                  operator_delete(local_208.first._M_dataplus._M_p,
                                  local_208.first.field_2._M_allocated_capacity + 1);
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)**(undefined8 **)(*(long *)pbVar15 + 8),
                         (*(undefined8 **)(*(long *)pbVar15 + 8))[1]);
              plVar28 = *(long **)(*(long *)pbVar15 + 0x28);
              plVar26 = *(long **)(*(long *)pbVar15 + 0x30);
              if (plVar28 != plVar26) {
                uVar22 = 0;
                do {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
                  uVar1 = *(uint *)(*(long *)pbVar15 + 0x40);
                  uVar16 = *(int *)(*(long *)pbVar15 + 0x44) + uVar1;
                  ppVar19 = (pointer)(ulong)uVar16;
                  if (uVar22 == uVar16) {
                    lVar12 = 3;
                    pcVar25 = "|| ";
LAB_00121451:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,pcVar25,lVar12);
                  }
                  else if (uVar22 == uVar1) {
                    lVar12 = 2;
                    pcVar25 = "| ";
                    goto LAB_00121451;
                  }
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"",1);
                  str_02.Length = (size_t)ppVar19;
                  str_02.Data = *(char **)(*plVar28 + 0x28);
                  llbuild::commands::util::escapedString_abi_cxx11_
                            (&local_208.first,*(util **)(*plVar28 + 0x20),str_02);
                  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,local_208.first._M_dataplus._M_p,
                                       local_208.first._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_208.first._M_dataplus._M_p != &local_208.first.field_2) {
                    operator_delete(local_208.first._M_dataplus._M_p,
                                    local_208.first.field_2._M_allocated_capacity + 1);
                  }
                  uVar22 = uVar22 + 1;
                  plVar28 = plVar28 + 1;
                } while (plVar28 != plVar26);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"  command = \"",0xd);
              str_03.Length = (size_t)ppVar19;
              str_03.Data = *(char **)(*(long *)pbVar15 + 0x78);
              llbuild::commands::util::escapedString_abi_cxx11_
                        (&local_208.first,*(util **)(*(long *)pbVar15 + 0x70),str_03);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,local_208.first._M_dataplus._M_p,
                                   local_208.first._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"\n",2);
              paVar33 = &local_208.first.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208.first._M_dataplus._M_p != paVar33) {
                operator_delete(local_208.first._M_dataplus._M_p,
                                local_208.first.field_2._M_allocated_capacity + 1);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"  description = \"",0x11);
              str_04.Length = (size_t)ppVar19;
              str_04.Data = *(char **)(*(long *)pbVar15 + 0x98);
              llbuild::commands::util::escapedString_abi_cxx11_
                        (&local_208.first,*(util **)(*(long *)pbVar15 + 0x90),str_04);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,local_208.first._M_dataplus._M_p,
                                   local_208.first._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"\n",2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208.first._M_dataplus._M_p != paVar33) {
                operator_delete(local_208.first._M_dataplus._M_p,
                                local_208.first.field_2._M_allocated_capacity + 1);
              }
              bVar9 = *(byte *)(*(long *)pbVar15 + 0x110) & 3;
              if (bVar9 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"  deps = gcc\n",0xd);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"  depfile = \"",0xd);
                str_05.Length = (size_t)ppVar19;
                str_05.Data = *(char **)(*(long *)pbVar15 + 0xb8);
                llbuild::commands::util::escapedString_abi_cxx11_
                          (&local_208.first,*(util **)(*(long *)pbVar15 + 0xb0),str_05);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,local_208.first._M_dataplus._M_p,
                                     local_208.first._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"\n",2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_208.first._M_dataplus._M_p != paVar33) {
                  operator_delete(local_208.first._M_dataplus._M_p,
                                  local_208.first.field_2._M_allocated_capacity + 1);
                }
              }
              else if (bVar9 == 2) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"  deps = msvc\n",0xe);
              }
              lVar12 = *(long *)pbVar15;
              ppVar19 = (pointer)CONCAT71((int7)((ulong)ppVar19 >> 8),*(byte *)(lVar12 + 0x110));
              if ((*(byte *)(lVar12 + 0x110) & 4) != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"  generator = 1\n",0x10);
                lVar12 = *(long *)pbVar15;
                ppVar19 = (pointer)CONCAT71((int7)((ulong)ppVar19 >> 8),
                                            *(undefined1 *)(lVar12 + 0x110));
              }
              if (((ulong)ppVar19 & 8) != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"  restat = 1\n",0xd);
                lVar12 = *(long *)pbVar15;
              }
              puVar21 = *(undefined8 **)(lVar12 + 0x68);
              if (puVar21 != (undefined8 *)0x0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"  pool = ",9);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,(char *)*puVar21,puVar21[1]);
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
              pbVar15 = pbVar15 + 8;
            } while (pbVar15 != local_1a0);
          }
          if (*(long *)&(local_1a8->buildCommand).super_SmallVector<char,_10240U>.
                        super_SmallVectorStorage<char,_10240U>.InlineElts[0x50].
                        super_AlignedCharArray<1UL,_1UL> !=
              *(long *)((local_1a8->buildCommand).super_SmallVector<char,_10240U>.
                        super_SmallVectorStorage<char,_10240U>.InlineElts + 0x58)) {
            pSVar3 = &local_1a8->buildCommand;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"# Default Targets\n",0x12);
            std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>::vector
                      ((vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_> *)
                       &local_208,
                       (vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_> *)
                       ((pSVar3->super_SmallVector<char,_10240U>).
                        super_SmallVectorStorage<char,_10240U>.InlineElts + 0x50));
            sVar20 = local_208.first._M_string_length;
            _Var23._M_p = local_208.first._M_dataplus._M_p;
            if (local_208.first._M_dataplus._M_p != (pointer)local_208.first._M_string_length) {
              lVar31 = local_208.first._M_string_length - (long)local_208.first._M_dataplus._M_p;
              uVar14 = lVar31 >> 3;
              lVar12 = 0x3f;
              if (uVar14 != 0) {
                for (; uVar14 >> lVar12 == 0; lVar12 = lVar12 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<llbuild::ninja::Node**,std::vector<llbuild::ninja::Node*,std::allocator<llbuild::ninja::Node*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__3>>
                        (local_208.first._M_dataplus._M_p,local_208.first._M_string_length,
                         ((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
              if (lVar31 < 0x81) {
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Node**,std::vector<llbuild::ninja::Node*,std::allocator<llbuild::ninja::Node*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__3>>
                          (_Var23._M_p,sVar20);
              }
              else {
                paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(_Var23._M_p + 0x80);
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Node**,std::vector<llbuild::ninja::Node*,std::allocator<llbuild::ninja::Node*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__3>>
                          (_Var23._M_p,paVar33);
                for (; paVar33 !=
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)sVar20;
                    paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(&paVar33->_M_allocated_capacity + 1)) {
                  std::
                  __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llbuild::ninja::Node**,std::vector<llbuild::ninja::Node*,std::allocator<llbuild::ninja::Node*>>>,__gnu_cxx::__ops::_Val_comp_iter<dumpNinjaManifestText(llvm::StringRef,llbuild::ninja::Manifest*)::__3>>
                            (paVar33);
                }
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"default ",8);
            sVar20 = local_208.first._M_string_length;
            for (_Var23._M_p = local_208.first._M_dataplus._M_p; _Var23._M_p != (pointer)sVar20;
                _Var23._M_p = _Var23._M_p + 8) {
              if (*(size_type *)_Var23._M_p != *(size_type *)local_208.first._M_dataplus._M_p) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"",1);
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   *(char **)(*(size_type *)_Var23._M_p + 0x20),
                                   *(long *)(*(size_type *)_Var23._M_p + 0x28));
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"",1);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n",2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208.first._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_208.first._M_dataplus._M_p,
                              local_208.first.field_2._M_allocated_capacity -
                              (long)local_208.first._M_dataplus._M_p);
            }
          }
          if ((basic *)local_198.
                       super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                       ._M_impl.super__Vector_impl_data._M_start != (basic *)0x0) {
            operator_delete(local_198.
                            super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_198.
                                  super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_198.
                                  super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((basic *)local_178._M_dataplus._M_p != (basic *)0x0) {
            operator_delete(local_178._M_dataplus._M_p,
                            local_178.field_2._M_allocated_capacity -
                            (long)local_178._M_dataplus._M_p);
          }
          this = (string *)local_1c8;
        }
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)this);
      }
      if (local_138._M_head_impl != (ManifestLoaderImpl *)0x0) {
        std::default_delete<llbuild::ninja::Manifest>::operator()
                  ((default_delete<llbuild::ninja::Manifest> *)&local_138,
                   (Manifest *)local_138._M_head_impl);
      }
      llbuild::ninja::ManifestLoader::~ManifestLoader(&local_f0);
      llbuild::ninja::ManifestLoaderActions::~ManifestLoaderActions(&local_58);
      if (local_110 != &local_100) {
        operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
      }
      iVar10 = 0;
    }
    else {
      executeLoadManifestCommand();
      iVar10 = 1;
    }
    if ((long *)local_e8.super_SmallVectorTemplateBase<char,_true>.
                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX != local_d8
       ) {
      free(local_e8.super_SmallVectorTemplateBase<char,_true>.
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
    }
  }
  else {
    executeLoadManifestCommand();
LAB_0011fff9:
    iVar10 = 1;
  }
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
    return iVar10;
  }
  return iVar10;
}

Assistant:

static int executeLoadManifestCommand(const std::vector<std::string>& args,
                                      bool loadOnly) {
  // Parse options.
  bool json = false;
  auto it = args.begin();
  for (; it != args.end() && StringRef(*it).startswith("-"); ++it) {
    auto arg = *it;

    if (arg == "--json") {
      json = true;
    } else {
      fprintf(stderr, "error: %s: unknown option: '%s'\n",
              getProgramName(), arg.c_str());
      return 1;
    }
  }
  if (it == args.end()) {
    fprintf(stderr, "error: %s: invalid number of arguments\n",
            getProgramName());
    return 1;
  }

  std::string filename = *it++;
  if (it != args.end()) {
    fprintf(stderr, "error: %s: invalid number of arguments\n",
            getProgramName());
    return 1;
  }

  // Change to the directory containing the input file, so include references
  // can be relative.
  //
  // FIXME: Need llvm::sys::fs.
  size_t pos = filename.find_last_of('/');
  if (pos != std::string::npos) {
    if (!sys::chdir(filename.substr(0, pos).c_str())) {
      fprintf(stderr, "error: %s: unable to chdir(): %s\n",
              getProgramName(), sys::strerror(errno).c_str());
      return 1;
    }
    filename = filename.substr(pos+1);
  }

  SmallString<128> current_dir;
  if (std::error_code ec = llvm::sys::fs::current_path(current_dir)) {
    fprintf(stderr, "%s: error: cannot determine current directory\n",
            getProgramName());
    return 1;
  }
  const std::string workingDirectory = current_dir.str();

  LoadManifestActions actions;
  ninja::ManifestLoader loader(workingDirectory, filename, actions);
  std::unique_ptr<ninja::Manifest> manifest = loader.load();

  // If only loading, we are done.
  if (loadOnly)
    return 0;

  if (json) {
    dumpNinjaManifestJSON(filename, manifest.get());
  } else {
    dumpNinjaManifestText(filename, manifest.get());
  }

  return 0;
}